

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O0

void * __thiscall
cookmem::MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
reallocate(MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void> *this
          ,void *ptr,size_type newUserSize)

{
  MemChunk *this_00;
  size_type requestSize;
  size_type sVar1;
  ulong local_68;
  void *newPtr;
  size_type newChunkSize;
  size_type newAllocSize;
  size_type oldChunkSize;
  size_type oldAllocSize;
  MemChunk *chunk;
  size_type newUserSize_local;
  void *ptr_local;
  MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void> *this_local;
  
  if (ptr == (void *)0x0) {
    this_local = (MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>
                  *)allocate(this,newUserSize);
  }
  else {
    this_00 = mem2Chunk(ptr);
    requestSize = MemChunk::getUserSize(this_00);
    sVar1 = calcChunkSize(requestSize);
    if (newUserSize < 0x10) {
      local_68 = 0x20;
    }
    else {
      local_68 = calcChunkSize(newUserSize);
    }
    if (sVar1 < local_68) {
      this_local = (MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>
                    *)allocate(this,newUserSize);
      if (this_local !=
          (MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void> *)0x0
         ) {
        memcpy(this_local,ptr,requestSize);
        deallocate(this,ptr,0);
      }
    }
    else {
      NoActionMemLogger::logReallocation(this->m_logger,ptr,requestSize,newUserSize);
      splitChunk(this,this_00,local_68);
      setUsed(this,this_00,newUserSize);
      this_local = (MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>
                    *)ptr;
    }
  }
  return this_local;
}

Assistant:

T*
    reallocate (T* ptr, size_type newUserSize)
    {
        if (ptr == nullptr)
        {
            return allocate(newUserSize);
        }

        MemChunk* chunk = mem2Chunk (ptr);
        size_type oldAllocSize = chunk->getUserSize ();
        size_type oldChunkSize = calcChunkSize(oldAllocSize);

        size_type newAllocSize = newUserSize;
        size_type newChunkSize = (newAllocSize < MIN_REQUEST) ? MIN_CHUNK_SIZE : calcChunkSize(newAllocSize);

        if (oldChunkSize < newChunkSize)
        {
            // For now we use a simple algorithm that allocate new memory.
            T* newPtr = allocate (newUserSize);
            if (newPtr)
            {
                memcpy(newPtr, ptr, oldAllocSize);
                deallocate (ptr);
            }
            return newPtr;
        }
        else
        {
            m_logger.logReallocation(ptr, oldAllocSize, newUserSize);

            // simply split the chunk
            splitChunk (chunk, newChunkSize);
            setUsed (chunk, newUserSize);
            return ptr;
        }
    }